

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintSmartPointer<void,std::shared_ptr<void>>
               (shared_ptr<void> *ptr,ostream *os,char param_3)

{
  bool bVar1;
  ostream *poVar2;
  element_type *p;
  void *pvVar3;
  char param_2_local;
  ostream *os_local;
  shared_ptr<void> *ptr_local;
  
  bVar1 = std::operator==(ptr,(nullptr_t)0x0);
  if (bVar1) {
    std::operator<<(os,"(nullptr)");
  }
  else {
    poVar2 = std::operator<<(os,"(");
    p = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                  (&ptr->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
    pvVar3 = VoidifyPointer(p);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar3);
    std::operator<<(poVar2,")");
  }
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, char) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    // We can't print the value. Just print the pointer..
    *os << "(" << (VoidifyPointer)(ptr.get()) << ")";
  }
}